

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

char ** __thiscall
axl::sl::Array<char_*,_axl::sl::ArrayDetails<char_*>_>::insertSpace
          (Array<char_*,_axl::sl::ArrayDetails<char_*>_> *this,size_t index,size_t count)

{
  ulong uVar1;
  bool bVar2;
  long in_RDX;
  ulong in_RSI;
  Array<char_*,_axl::sl::ArrayDetails<char_*>_> *in_RDI;
  char **dst;
  bool result;
  size_t oldCount;
  size_t in_stack_ffffffffffffffb8;
  ulong local_18;
  EVP_PKEY_CTX *local_8;
  
  uVar1 = (in_RDI->super_ArrayRef<char_*,_axl::sl::ArrayDetails<char_*>_>).m_count;
  bVar2 = setCount(in_RDI,in_stack_ffffffffffffffb8);
  if (bVar2) {
    local_18 = in_RSI;
    if (uVar1 < in_RSI) {
      local_18 = uVar1;
    }
    local_8 = (EVP_PKEY_CTX *)
              ((in_RDI->super_ArrayRef<char_*,_axl::sl::ArrayDetails<char_*>_>).m_p + local_18);
    if ((in_RDX != 0) && (local_18 < uVar1)) {
      SimpleArrayDetails<char_*>::copy
                ((SimpleArrayDetails<char_*> *)(local_8 + in_RDX * 8),local_8,
                 (EVP_PKEY_CTX *)(uVar1 - local_18));
    }
  }
  else {
    local_8 = (EVP_PKEY_CTX *)0x0;
  }
  return (char **)local_8;
}

Assistant:

T*
	insertSpace(
		size_t index,
		size_t count
	) {
		size_t oldCount = this->m_count;
		bool result = setCount(this->m_count + count);
		if (!result)
			return NULL;

		if (index > oldCount)
			index = oldCount;

		T* dst = this->m_p + index;

		if (count && index < oldCount)
			Details::copy(dst + count, dst, oldCount - index);

		return dst;
	}